

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 jx9CsvConsumer(char *zToken,int nTokenLen,void *pUserData)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  char *pcVar4;
  ushort **ppuVar5;
  uint uVar6;
  char *pcVar7;
  ulong uVar8;
  jx9_value sEntry;
  SyString local_78;
  jx9_value local_68;
  
  local_78.zString = zToken;
  uVar6 = nTokenLen;
  if (nTokenLen != 0) {
    pcVar4 = zToken + 1;
    local_78.zString = zToken;
    local_78.nByte = nTokenLen;
    do {
      pcVar7 = pcVar4;
      cVar1 = pcVar7[-1];
      uVar6 = nTokenLen;
      if ((0xffffffffffffffbf < (ulong)(long)cVar1) ||
         ((cVar1 != '\0' &&
          (ppuVar5 = __ctype_b_loc(), uVar6 = nTokenLen,
          (*(byte *)((long)*ppuVar5 + (long)cVar1 * 2 + 1) & 0x20) == 0)))) break;
      nTokenLen = nTokenLen - 1;
      pcVar4 = pcVar7 + 1;
      local_78.zString = pcVar7;
      uVar6 = nTokenLen;
    } while (nTokenLen != 0);
  }
  local_78.nByte = uVar6;
  pcVar4 = local_78.zString;
  uVar8 = (ulong)local_78.nByte;
  uVar6 = local_78.nByte;
  do {
    local_78.nByte = uVar6;
    bVar3 = local_78.nByte != 0;
    if (!bVar3) {
      return 0;
    }
    uVar6 = (int)uVar8 - 1;
    uVar8 = (ulong)uVar6;
    bVar2 = pcVar4[uVar8];
  } while ((bVar2 < 0xc0) &&
          ((bVar2 == 0 ||
           (ppuVar5 = __ctype_b_loc(),
           (*(byte *)((long)*ppuVar5 + (long)(char)bVar2 * 2 + 1) & 0x20) != 0))));
  if (bVar3) {
    jx9MemObjInitFromString(*(jx9_vm **)((long)pUserData + 0x10),&local_68,&local_78);
    if ((*(byte *)((long)pUserData + 8) & 0x40) != 0) {
      HashmapInsert(*pUserData,(jx9_value *)0x0,&local_68);
    }
    jx9MemObjRelease(&local_68);
  }
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 jx9CsvConsumer(const char *zToken, int nTokenLen, void *pUserData)
{
	jx9_value *pArray = (jx9_value *)pUserData;
	jx9_value sEntry;
	SyString sToken;
	/* Insert the token in the given array */
	SyStringInitFromBuf(&sToken, zToken, nTokenLen);
	/* Remove trailing and leading white spcaces and null bytes */
	SyStringFullTrimSafe(&sToken);
	if( sToken.nByte < 1){
		return SXRET_OK;
	}
	jx9MemObjInitFromString(pArray->pVm, &sEntry, &sToken);
	jx9_array_add_elem(pArray, 0, &sEntry);
	jx9MemObjRelease(&sEntry);
	return SXRET_OK;
}